

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O1

size_t gf2Create_deep(size_t m)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong n;
  
  n = m + 0x3f >> 6;
  sVar1 = ppMul_deep(n,n);
  sVar2 = ppSqr_deep(n);
  sVar3 = ppMul_deep(n,n);
  sVar4 = ppSqr_deep(n);
  sVar5 = ppMul_deep(n,n);
  sVar6 = ppSqr_deep(n);
  sVar7 = ppInvMod_deep(n + 1);
  sVar8 = ppDivMod_deep(n + 1);
  sVar1 = utilMax(8,sVar1,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7 + n * 8 + 8,sVar8 + n * 8 + 8);
  return sVar1;
}

Assistant:

size_t gf2Create_deep(size_t m)
{
	const size_t n = W_OF_B(m);
	return utilMax(8, 
		gf2MulTrinomial0_deep(n),
		gf2SqrTrinomial0_deep(n),
		gf2MulTrinomial1_deep(n),
		gf2SqrTrinomial1_deep(n),
		gf2MulPentanomial_deep(n),
		gf2SqrPentanomial_deep(n),
		gf2Inv_deep(n),
		gf2Div_deep(n));
}